

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

void free_master(CManager cm,void *vmaster)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < *(int *)((long)vmaster + 0x34); lVar3 = lVar3 + 1) {
    free(*(void **)((long)*(void **)((long)vmaster + 0x38) + lVar2));
    free(*(void **)(*(long *)((long)vmaster + 0x38) + 8 + lVar2));
    lVar1 = *(long *)((long)vmaster + 0x38);
    if (*(long *)(lVar1 + 0x10 + lVar2) != 0) {
      free_attr_list();
      lVar1 = *(long *)((long)vmaster + 0x38);
    }
    free(*(void **)(lVar1 + 0x18 + lVar2));
    lVar2 = lVar2 + 0x38;
  }
  free(*(void **)((long)vmaster + 0x38));
  free(*(void **)((long)vmaster + 0x48));
  free(vmaster);
  return;
}

Assistant:

static void
free_master(CManager cm, void *vmaster)
{
    EVmaster master = (EVmaster)vmaster;
    int i;
    for (i=0; i < master->node_count; i++) {
	if (master->nodes[i].name) free(master->nodes[i].name);
	if (master->nodes[i].canonical_name) 
	    free(master->nodes[i].canonical_name);
	if (master->nodes[i].contact_list) 
	    free_attr_list(master->nodes[i].contact_list);
	if (master->nodes[i].str_contact_list) 
	    free(master->nodes[i].str_contact_list);
    }
    free(master->nodes);
    if (master->my_contact_str) free(master->my_contact_str);
    free(master);
}